

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_all_apis.cpp
# Opt level: O3

void __thiscall APITests::test_gpio_function_in(APITests *this)

{
  int iVar1;
  string local_38;
  
  GPIO::setmode(BOARD);
  GPIO::setup((this->pin_data).in_a,IN,-1);
  iVar1 = GPIO::gpio_function((this->pin_data).in_a);
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"");
  assert::is_true(iVar1 == 2,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  GPIO::cleanup();
  return;
}

Assistant:

void test_gpio_function_in()
    {
        GPIO::setmode(GPIO::BOARD);
        GPIO::setup(pin_data.in_a, GPIO::IN);
        auto val = GPIO::gpio_function(pin_data.in_a);
        assert::is_true(val == GPIO::Directions::IN);
        GPIO::cleanup();
    }